

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bst.c
# Opt level: O1

void insert_node(vmd_bst_t *tree,vmd_bst_node_t *node)

{
  byte bVar1;
  char cVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  vmd_bst_t *pvVar7;
  vmd_bst_node_t *child;
  vmd_bst_t *node_00;
  
  node->field_0x20 = node->field_0x20 & 0xf8;
  node->child[0] = (vmd_bst_node_t *)0x0;
  node->child[1] = (vmd_bst_node_t *)0x0;
  pvVar7 = (vmd_bst_t *)(tree->head).child[0];
  if (pvVar7 == (vmd_bst_t *)0x0) {
    uVar6 = 0;
    uVar4 = 0;
    node_00 = tree;
  }
  else {
    do {
      node_00 = pvVar7;
      uVar4 = (*tree->cmp)(&node->field_0x21,&(node_00->head).field_0x21);
      uVar6 = (ulong)(-1 < (int)uVar4);
      pvVar7 = (vmd_bst_t *)(node_00->head).child[uVar6];
    } while (pvVar7 != (vmd_bst_t *)0x0);
    uVar4 = ~uVar4 >> 0x1f;
  }
  (node_00->head).child[uVar6] = node;
  if (node != (vmd_bst_node_t *)0x0) {
    node->parent = &node_00->head;
    node->field_0x20 = node->field_0x20 & 0xf7 | (char)uVar4 * '\b';
  }
  if (((vmd_bst_t *)node != tree) && (pvVar7 = (vmd_bst_t *)node, tree->upd != (vmd_bst_upd_t)0x0))
  {
    do {
      (*tree->upd)(&pvVar7->head);
      pvVar7 = (vmd_bst_t *)(pvVar7->head).parent;
    } while (pvVar7 != tree);
  }
  for (; node_00 != tree; node_00 = (vmd_bst_t *)(node_00->head).parent) {
    cVar2 = '\a';
    if (uVar4 == 0) {
      cVar2 = '\x01';
    }
    bVar1 = (node_00->head).field_0x20;
    bVar3 = cVar2 + bVar1 & 7;
    (node_00->head).field_0x20 = bVar1 & 0xf8 | bVar3;
    if ((bVar3 == 0) || (iVar5 = rebalance(tree,&node_00->head), iVar5 != 0)) break;
    uVar4 = *(uint *)&(node_00->head).field_0x20 >> 3 & 1;
  }
  if ((node->field_0x20 & 0x10) != 0) {
    __assert_fail("!node->in_tree",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/an146[P]libvomid/src/bst.c"
                  ,0xe7,"void insert_node(vmd_bst_t *, vmd_bst_node_t *)");
  }
  node->field_0x20 = node->field_0x20 | 0x10;
  tree->tree_size = tree->tree_size + 1;
  return;
}

Assistant:

static void
insert_node(bst_t *tree, bst_node_t *node)
{
	bst_node_t *i = &tree->head;
	int dir = 0;

	node->balance = 0;
	node->child[0] = node->child[1] = NULL;

	while (i->child[dir] != NULL) {
		i = i->child[dir];
		dir = (tree->cmp(node->data, i->data) >= 0);
	}

	set_child(i, dir, node);
	update_to_top(tree, node);

	for (; i != &tree->head; i = i->parent) {
		i->balance += (dir ? -1 : 1);
		if (i->balance == 0 || rebalance(tree, i))
			break;
		dir = i->idx;
	}

	assert(!node->in_tree);
	node->in_tree = 1;
	tree->tree_size++;
}